

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::ImageButton(Sprite *sprite,Vector2f *size,int framePadding,Color *bgColor,
                       Color *tintColor)

{
  uint glTextureHandle;
  IntRect *pIVar1;
  ImTextureID user_texture_id;
  ImVec4 local_c4;
  ImVec4 local_b4;
  Color local_a4;
  ImVec4 local_a0;
  ImVec4 local_90;
  ImVec2 local_80;
  ImTextureID local_78;
  ImTextureID textureID;
  ImVec2 uv1;
  ImVec2 uv0;
  IntRect *textureRect;
  Vector2<float> local_50;
  Vector2f textureSize;
  Texture *texture;
  Texture *texturePtr;
  Color *tintColor_local;
  Color *bgColor_local;
  int framePadding_local;
  Vector2f *size_local;
  Sprite *sprite_local;
  
  textureSize = (Vector2f)sf::Sprite::getTexture(sprite);
  if (textureSize == (Vector2f)0x0) {
    sprite_local._7_1_ = false;
  }
  else {
    textureRect = (IntRect *)sf::Texture::getSize((Texture *)textureSize);
    sf::Vector2<float>::Vector2<unsigned_int>(&local_50,(Vector2<unsigned_int> *)&textureRect);
    pIVar1 = sf::Sprite::getTextureRect(sprite);
    ImVec2::ImVec2(&uv1,(float)pIVar1->left / local_50.x,(float)pIVar1->top / local_50.y);
    ImVec2::ImVec2((ImVec2 *)&textureID,(float)(pIVar1->left + pIVar1->width) / local_50.x,
                   (float)(pIVar1->top + pIVar1->height) / local_50.y);
    glTextureHandle = sf::Texture::getNativeHandle((Texture *)textureSize);
    user_texture_id = anon_unknown.dwarf_f6bf2::convertGLTextureHandleToImTextureID(glTextureHandle)
    ;
    local_78 = user_texture_id;
    ImVec2::ImVec2(&local_80,size->x,size->y);
    local_a4 = *bgColor;
    local_a0 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(local_a4);
    local_90 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_a0);
    local_c4 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(*tintColor);
    local_b4 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_c4);
    sprite_local._7_1_ =
         ImageButton(user_texture_id,&local_80,&uv1,(ImVec2 *)&textureID,framePadding,&local_90,
                     &local_b4);
  }
  return sprite_local._7_1_;
}

Assistant:

bool ImageButton(const sf::Sprite& sprite, const sf::Vector2f& size, const int framePadding,
                 const sf::Color& bgColor, const sf::Color& tintColor) {
    const sf::Texture* texturePtr = sprite.getTexture();
    // sprite without texture cannot be drawn
    if (!texturePtr) {
        return false;
    }

    const sf::Texture& texture = *texturePtr;
    sf::Vector2f textureSize = static_cast<sf::Vector2f>(texture.getSize());
    const sf::IntRect& textureRect = sprite.getTextureRect();
    ImVec2 uv0(textureRect.left / textureSize.x, textureRect.top / textureSize.y);
    ImVec2 uv1((textureRect.left + textureRect.width) / textureSize.x,
               (textureRect.top + textureRect.height) / textureSize.y);

    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());
    return ImGui::ImageButton(textureID, ImVec2(size.x, size.y), uv0, uv1, framePadding,
                              toImColor(bgColor), toImColor(tintColor));
}